

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

vector<Edge_*,_std::allocator<Edge_*>_> * __thiscall
RealCommandRunner::GetActiveEdges
          (vector<Edge_*,_std::allocator<Edge_*>_> *__return_storage_ptr__,RealCommandRunner *this)

{
  pointer *pppEVar1;
  iterator __position;
  _Rb_tree_node_base *p_Var2;
  
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
                ((vector<Edge*,std::allocator<Edge*>> *)__return_storage_ptr__,__position,
                 (Edge **)&p_Var2[1]._M_parent);
    }
    else {
      *__position._M_current = (Edge *)p_Var2[1]._M_parent;
      pppEVar1 = &(__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Edge*> RealCommandRunner::GetActiveEdges() {
  vector<Edge*> edges;
  for (map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.begin();
       e != subproc_to_edge_.end(); ++e)
    edges.push_back(e->second);
  return edges;
}